

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_typedef(lys_ypr_ctx_conflict *pctx,lysp_tpdf *tpdf)

{
  uint16_t *puVar1;
  lysp_ext_instance *plVar2;
  char *text;
  uint uVar3;
  lysp_ext_instance *plVar4;
  uint64_t u;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *ext;
  
  ypr_open(pctx,"typedef","name",tpdf->name,'\x01');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  plVar2 = tpdf->exts;
  plVar5 = (lysp_ext_instance *)0x0;
  ext = plVar2;
  while( true ) {
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar2[-1].exts;
    }
    if (plVar4 <= plVar5) break;
    yprp_extension_instance(pctx,LY_STMT_TYPEDEF,'\0',ext,(int8_t *)0x0);
    plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
    ext = ext + 1;
  }
  yprp_type(pctx,&tpdf->type);
  if (tpdf->units != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_UNITS,'\0',tpdf->units,tpdf->exts);
  }
  text = (tpdf->dflt).str;
  if (text != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',text,tpdf->exts);
  }
  ypr_status(pctx,tpdf->flags,tpdf->exts,(int8_t *)0x0);
  if (tpdf->dsc != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',tpdf->dsc,tpdf->exts);
  }
  if (tpdf->ref != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',tpdf->ref,tpdf->exts);
  }
  uVar3 = *(int *)((long)&pctx->field_0 + 8) - 1;
  (pctx->field_0).field_0.level = (uint16_t)uVar3;
  uVar3 = (uVar3 & 0xffff) * 2;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
      (undefined1  [24])0x0) {
    uVar3 = 0;
  }
  ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",(ulong)uVar3,"","typedef");
  return;
}

Assistant:

static void
yprp_typedef(struct lys_ypr_ctx *pctx, const struct lysp_tpdf *tpdf)
{
    ypr_open(pctx, "typedef", "name", tpdf->name, 1);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_TYPEDEF, 0, tpdf->exts, NULL);

    yprp_type(pctx, &tpdf->type);

    if (tpdf->units) {
        ypr_substmt(pctx, LY_STMT_UNITS, 0, tpdf->units, tpdf->exts);
    }
    if (tpdf->dflt.str) {
        ypr_substmt(pctx, LY_STMT_DEFAULT, 0, tpdf->dflt.str, tpdf->exts);
    }

    ypr_status(pctx, tpdf->flags, tpdf->exts, NULL);
    ypr_description(pctx, tpdf->dsc, tpdf->exts, NULL);
    ypr_reference(pctx, tpdf->ref, tpdf->exts, NULL);

    LEVEL--;
    ypr_close(pctx, "typedef", 1);
}